

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O3

void debugFindParent(DdManager *table,DdNode *node)

{
  DdNode **ppDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  long lVar4;
  long lVar5;
  DdNode *pDVar6;
  long lVar7;
  
  lVar5 = 0;
  while( true ) {
    lVar4 = 0x7fffffff;
    if ((ulong)node->index != 0x7fffffff) {
      lVar4 = (long)table->perm[node->index];
    }
    if (lVar4 <= lVar5) break;
    lVar4 = (long)(int)table->subtables[lVar5].slots;
    if (0 < lVar4) {
      ppDVar1 = table->subtables[lVar5].nodelist;
      lVar7 = 0;
      do {
        for (pDVar6 = ppDVar1[lVar7]; pDVar6 != (DdNode *)0x0; pDVar6 = pDVar6->next) {
          pDVar2 = (pDVar6->type).kids.T;
          pDVar3 = (pDVar6->type).kids.E;
          if ((pDVar2 == node) || ((DdNode *)((ulong)pDVar3 & 0xfffffffffffffffe) == node)) {
            fprintf((FILE *)table->out,
                    "parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",pDVar6,
                    (ulong)pDVar6->index,(ulong)pDVar6->ref,pDVar2,pDVar3);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar4);
    }
    lVar5 = lVar5 + 1;
  }
  return;
}

Assistant:

static void
debugFindParent(
  DdManager * table,
  DdNode * node)
{
    int         i,j;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;

    for (i = 0; i < cuddI(table,node->index); i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        for (j=0;j<slots;j++) {
            f = nodelist[j];
            while (f != NULL) {
                if (cuddT(f) == node || Cudd_Regular(cuddE(f)) == node) {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out,"parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                        (ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
                    (void) fprintf(table->out,"parent is at 0x%x, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",
                        (ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
                }
                f = f->next;
            }
        }
    }

}